

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxy.cpp
# Opt level: O2

void __thiscall
Shell::EqualityProxy::getArgumentEqualityLiterals
          (EqualityProxy *this,uint cnt,LiteralStack *lits,Stack<Kernel::TermList> *vars1,
          Stack<Kernel::TermList> *vars2,OperatorType *symbolType)

{
  int iVar1;
  TermList TVar2;
  TermList TVar3;
  Literal *elem;
  TermList TVar4;
  TermList arg0;
  ulong uVar5;
  uint uVar6;
  
  lits->_cursor = lits->_stack;
  vars1->_cursor = vars1->_stack;
  vars2->_cursor = vars2->_stack;
  TVar4._content = (uint64_t)vars1;
  if (getArgumentEqualityLiterals(unsigned_int,Lib::Stack<Kernel::Literal*>&,Lib::Stack<Kernel::TermList>&,Lib::Stack<Kernel::TermList>&,Kernel::OperatorType*)
      ::localSubst == '\0') {
    iVar1 = __cxa_guard_acquire(&getArgumentEqualityLiterals(unsigned_int,Lib::Stack<Kernel::Literal*>&,Lib::Stack<Kernel::TermList>&,Lib::Stack<Kernel::TermList>&,Kernel::OperatorType*)
                                 ::localSubst);
    if (iVar1 != 0) {
      getArgumentEqualityLiterals::localSubst._map._timestamp = 1;
      getArgumentEqualityLiterals::localSubst._map._size = 0;
      getArgumentEqualityLiterals::localSubst._map._deleted = 0;
      getArgumentEqualityLiterals::localSubst._map._capacityIndex = 0;
      getArgumentEqualityLiterals::localSubst._map._capacity = 0;
      getArgumentEqualityLiterals::localSubst._map._20_8_ = 0;
      getArgumentEqualityLiterals::localSubst._map._28_8_ = 0;
      getArgumentEqualityLiterals::localSubst._map._afterLast._4_4_ = 0;
      __cxa_atexit(Kernel::Substitution::~Substitution,&getArgumentEqualityLiterals::localSubst,
                   &__dso_handle);
      __cxa_guard_release(&getArgumentEqualityLiterals(unsigned_int,Lib::Stack<Kernel::Literal*>&,Lib::Stack<Kernel::TermList>&,Lib::Stack<Kernel::TermList>&,Kernel::OperatorType*)
                           ::localSubst);
    }
  }
  Kernel::Substitution::reset(&getArgumentEqualityLiterals::localSubst);
  uVar6 = 5;
  for (uVar5 = 0; cnt != uVar5; uVar5 = uVar5 + 1) {
    arg0._content._0_4_ = uVar6 - 4;
    arg0._content._4_4_ = 0;
    TVar2 = Kernel::OperatorType::arg(symbolType,(uint)uVar5);
    TVar3 = Kernel::AtomicSort::superSort();
    if (TVar2._content == TVar3._content) {
      Kernel::Substitution::bind
                (&getArgumentEqualityLiterals::localSubst,(uint)uVar5 & 0x3fffffff,
                 (sockaddr *)arg0._content,(socklen_t)TVar4._content);
      TVar3._content = arg0._content;
    }
    else {
      TVar3._content._4_4_ = 0;
      TVar3._content._0_4_ = uVar6;
      TVar2 = Kernel::SubstHelper::applyImpl<false,Kernel::Substitution>
                        (TVar2,&getArgumentEqualityLiterals::localSubst,false);
      TVar4._content = TVar3._content;
      elem = makeProxyLiteral(this,false,arg0,TVar3,TVar2);
      Lib::Stack<Kernel::Literal_*>::push(lits,elem);
    }
    Lib::Stack<Kernel::TermList>::push(vars1,arg0);
    Lib::Stack<Kernel::TermList>::push(vars2,TVar3);
    uVar6 = uVar6 + 8;
  }
  return;
}

Assistant:

void EqualityProxy::getArgumentEqualityLiterals(unsigned cnt, LiteralStack& lits,
    Stack<TermList>& vars1, Stack<TermList>& vars2, OperatorType* symbolType)
{
  ASS_EQ(cnt, symbolType->arity());

  lits.reset();
  vars1.reset();
  vars2.reset();

  static Substitution localSubst;
  localSubst.reset();

  for (unsigned i=0; i<cnt; i++) {
    TermList v1(2*i, false);
    TermList v2(2*i+1, false);
    TermList sort = symbolType->arg(i);
    if(sort != AtomicSort::superSort()){
      lits.push(makeProxyLiteral(false, v1, v2, SubstHelper::apply(sort, localSubst)));
      vars1.push(v1);
      vars2.push(v2);
    } else {
      TermList var = symbolType->quantifiedVar(i);
      localSubst.bind(var.var(), v1);
      vars1.push(v1);
      vars2.push(v1);
    }
  }
}